

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall FIX::Message::Message(Message *this,BeginString *beginString,MsgType *msgType)

{
  message_order local_40;
  FieldBase *local_20;
  MsgType *msgType_local;
  BeginString *beginString_local;
  Message *this_local;
  
  local_20 = (FieldBase *)msgType;
  msgType_local = (MsgType *)beginString;
  beginString_local = (BeginString *)this;
  message_order::message_order(&local_40,normal);
  FieldMap::FieldMap(&this->super_FieldMap,&local_40);
  message_order::~message_order(&local_40);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_0030c368;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  FieldMap::setField(&(this->m_header).super_FieldMap,(FieldBase *)msgType_local,true);
  FieldMap::setField(&(this->m_header).super_FieldMap,local_20,true);
  return;
}

Assistant:

Message::Message( const BeginString& beginString, const MsgType& msgType )
: m_validStructure(true)
, m_tag( 0 )
{
  m_header.setField(beginString);
  m_header.setField(msgType);
}